

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

bool Catch::
     compareEqual<frozen::basic_string<char8_t>,std::basic_string_view<char8_t,std::char_traits<char8_t>>>
               (basic_string<char8_t> *lhs,
               basic_string_view<char8_t,_std::char_traits<char8_t>_> *rhs)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar1 = lhs->size_;
  if (uVar1 != rhs->_M_len) {
    return false;
  }
  bVar4 = uVar1 == 0;
  if (!bVar4) {
    if (*lhs->data_ != *rhs->_M_str) {
      return false;
    }
    uVar2 = 1;
    do {
      uVar3 = uVar2;
      if (uVar1 == uVar3) break;
      uVar2 = uVar3 + 1;
    } while (lhs->data_[uVar3] == rhs->_M_str[uVar3]);
    bVar4 = uVar1 <= uVar3;
  }
  return bVar4;
}

Assistant:

constexpr bool operator==(basic_string other) const {
    if (size_ != other.size_)
      return false;
    for (std::size_t i = 0; i < size_; ++i)
      if (data_[i] != other.data_[i])
        return false;
    return true;
  }